

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

string * duckdb::SanitizeValue(string *__return_storage_ptr__,string *input)

{
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  StringUtil::RTrim((string *)input);
  ::std::__cxx11::string::string((string *)&local_30,(string *)input);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_2_ = 0;
  local_50._M_string_length = 1;
  ::std::__cxx11::string::string((string *)&local_70,"\\0",&local_71);
  StringUtil::Replace((string *)__return_storage_ptr__,&local_30,&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static string SanitizeValue(string input) {
	// some results might contain padding spaces, e.g. when rendering
	// VARCHAR(10) and the string only has 6 characters, they will be padded
	// with spaces to 10 in the rendering. We don't do that here yet as we
	// are looking at internal structures. So just ignore any extra spaces
	// on the right
	StringUtil::RTrim(input);
	// for result checking code, replace null bytes with their escaped value (\0)
	return StringUtil::Replace(input, string("\0", 1), "\\0");
}